

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O0

void R_ExecuteSetViewSize(void)

{
  int iVar1;
  int iVar2;
  int fullHeight;
  undefined4 local_18;
  
  setsizeneeded = false;
  V_SetBorderNeedRefresh();
  iVar1 = setblocks;
  iVar2 = DCanvas::GetWidth((DCanvas *)screen);
  fullHeight = DCanvas::GetHeight((DCanvas *)screen);
  R_SetWindow(iVar1,iVar2,fullHeight,ST_Y,false);
  iVar2 = DCanvas::GetWidth((DCanvas *)screen);
  iVar1 = viewwidth;
  viewwindowx = iVar2 - viewwidth >> 1;
  iVar2 = DCanvas::GetWidth((DCanvas *)screen);
  if (iVar1 == iVar2) {
    local_18 = 0;
  }
  else {
    local_18 = ST_Y - viewheight >> 1;
  }
  viewwindowy = local_18;
  return;
}

Assistant:

void R_ExecuteSetViewSize ()
{
	setsizeneeded = false;
	V_SetBorderNeedRefresh();

	R_SetWindow (setblocks, SCREENWIDTH, SCREENHEIGHT, ST_Y);

	// Handle resize, e.g. smaller view windows with border and/or status bar.
	viewwindowx = (screen->GetWidth() - viewwidth) >> 1;

	// Same with base row offset.
	viewwindowy = (viewwidth == screen->GetWidth()) ? 0 : (ST_Y - viewheight) >> 1;
}